

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void ins_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Prefix).RepnePrefix == '\x02') {
    (pMyDisasm->Prefix).RepnePrefix = '\x01';
  }
  if ((pMyDisasm->Prefix).RepPrefix == '\x02') {
    (pMyDisasm->Prefix).RepPrefix = '\x01';
  }
  (pMyDisasm->Instruction).Category = 0x10008;
  if ((pMyDisasm->Reserved_).OperandSize < 0x20) {
    strcpy((pMyDisasm->Instruction).Mnemonic,"insw");
    (pMyDisasm->Operand1).OpType = 0x30000;
    (pMyDisasm->Operand1).OpSize = 0x10;
    (pMyDisasm->Operand1).Memory.BaseRegister = 0x80;
    (pMyDisasm->Operand2).OpType = 0x20000;
    (pMyDisasm->Operand2).Registers.type = 1;
    (pMyDisasm->Operand2).Registers.gpr = 4;
    (pMyDisasm->Operand2).OpSize = 0x10;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    FillFlags(pMyDisasm,0x29);
  }
  else {
    strcpy((pMyDisasm->Instruction).Mnemonic,"insd");
    (pMyDisasm->Operand1).OpType = 0x30000;
    (pMyDisasm->Operand1).OpSize = 0x20;
    (pMyDisasm->Operand1).Memory.BaseRegister = 0x80;
    (pMyDisasm->Operand2).OpType = 0x20000;
    (pMyDisasm->Operand2).Registers.type = 1;
    (pMyDisasm->Operand2).Registers.gpr = 4;
    (pMyDisasm->Operand2).OpSize = 0x10;
    (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
    FillFlags(pMyDisasm,0x29);
  }
  return;
}

Assistant:

void __bea_callspec__ ins_(PDISASM pMyDisasm)
{
    if (pMyDisasm->Prefix.RepnePrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepnePrefix = InUsePrefix;
    }
    if (pMyDisasm->Prefix.RepPrefix == SuperfluousPrefix) {
        pMyDisasm->Prefix.RepPrefix = InUsePrefix;
    }
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+InOutINSTRUCTION;
    if (GV.OperandSize >= 32) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "insd");
        #endif
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
        pMyDisasm->Operand2.Registers.type = GENERAL_REG;
        pMyDisasm->Operand2.Registers.gpr = REG2;
        pMyDisasm->Operand2.OpSize = 16;
        GV.EIP_++;
        FillFlags(pMyDisasm, 41);
    }
    else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "insw");
        #endif
        pMyDisasm->Operand1.OpType = MEMORY_TYPE;
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand1.Memory.BaseRegister = REG7;
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
        pMyDisasm->Operand2.Registers.type = GENERAL_REG;
        pMyDisasm->Operand2.Registers.gpr = REG2;
        pMyDisasm->Operand2.OpSize = 16;
        GV.EIP_++;
        FillFlags(pMyDisasm, 41);
    }
}